

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O3

int drop(obj *obj,obj *ostack)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char buf [256];
  char acStack_128 [256];
  
  if (obj == (obj *)0x0) {
    return 0;
  }
  bVar1 = canletgo(obj,"drop");
  if (bVar1 != '\0') {
    if (uwep == obj) {
      iVar2 = welded(uwep);
      if (iVar2 != 0) {
        weldmsg(obj);
        return 0;
      }
      setuwep((obj *)0x0);
    }
    if (uquiver == obj) {
      setuqwep((obj *)0x0);
    }
    if (uswapwep == obj) {
      setuswapwep((obj *)0x0);
    }
    obj->field_0x4d = obj->field_0x4d | 1;
    if ((u._1052_1_ & 1) == 0) {
      if (((obj->oclass == '\x04') || (obj->otyp == 0x113)) &&
         (level->locations[u.ux][u.uy].typ == '\x1f')) {
        dosinkring(obj);
        return 1;
      }
      bVar1 = can_reach_floor();
      if (bVar1 == '\0') {
        if (flags.verbose != '\0') {
          pcVar4 = doname(obj);
          pline("You drop %s.",pcVar4);
        }
        if (obj->oclass == '\f') {
          iflags.botl = '\x01';
        }
        freeinv(obj);
        hitfloor(obj,ostack,'\0');
        return 1;
      }
      if ((level->locations[u.ux][u.uy].typ != '!') && (flags.verbose != '\0')) {
        pcVar4 = doname(obj);
        pline("You drop %s.",pcVar4);
      }
    }
    else if (flags.verbose != '\0') {
      pcVar4 = mon_nam(u.ustuck);
      pcVar4 = s_suffix(pcVar4);
      strcpy(acStack_128,pcVar4);
      pcVar4 = doname(obj);
      pcVar3 = mbodypart(u.ustuck,0x12);
      pline("You drop %s into %s %s.",pcVar4,acStack_128,pcVar3);
    }
    dropx(obj);
    return 1;
  }
  return 0;
}

Assistant:

static int drop(struct obj *obj, struct obj *ostack)
{
	if (!obj) return 0;
	if (!canletgo(obj,"drop"))
		return 0;
	if (obj == uwep) {
		if (welded(uwep)) {
			weldmsg(obj);
			return 0;
		}
		setuwep(NULL);
	}
	if (obj == uquiver) {
		setuqwep(NULL);
	}
	if (obj == uswapwep) {
		setuswapwep(NULL);
	}

	obj->was_dropped = 1;

	if (u.uswallow) {
		/* barrier between you and the floor */
		if (flags.verbose)
		{
			char buf[BUFSZ];

			/* doname can call s_suffix, reusing its buffer */
			strcpy(buf, s_suffix(mon_nam(u.ustuck)));
			pline("You drop %s into %s %s.", doname(obj), buf,
				mbodypart(u.ustuck, STOMACH));
		}
	} else {
	    if ((obj->oclass == RING_CLASS || obj->otyp == MEAT_RING) &&
			IS_SINK(level->locations[u.ux][u.uy].typ)) {
		dosinkring(obj);
		return 1;
	    }
	    if (!can_reach_floor()) {
		if (flags.verbose) pline("You drop %s.", doname(obj));

		/* Ensure update when we drop gold objects */
		if (obj->oclass == COIN_CLASS) iflags.botl = 1;
		freeinv(obj);
		hitfloor(obj, ostack, FALSE);
		return 1;
	    }
	    if (!IS_ALTAR(level->locations[u.ux][u.uy].typ) && flags.verbose)
		pline("You drop %s.", doname(obj));
	}
	dropx(obj);
	return 1;
}